

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

char * __thiscall cmsys::RegExpCompile::reg(RegExpCompile *this,int paren,int *flagp)

{
  int iVar1;
  uint uVar2;
  ushort uVar3;
  ulong in_RAX;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  int flags;
  undefined8 uStack_38;
  
  *flagp = 1;
  uStack_38 = in_RAX;
  if (paren == 0) {
    pcVar6 = regbranch(this,(int *)((long)&uStack_38 + 4));
    cVar7 = '\0';
    if (pcVar6 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    iVar1 = this->regnpar;
    if (9 < iVar1) {
      pcVar6 = "RegularExpression::compile(): Too many parentheses.";
      goto LAB_0010e04c;
    }
    this->regnpar = iVar1 + 1;
    pcVar4 = this->regcode;
    if (pcVar4 == &regdummy) {
      this->regsize = this->regsize + 3;
    }
    else {
      *pcVar4 = (char)iVar1 + '\x14';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      this->regcode = pcVar4 + 3;
    }
    pcVar6 = regbranch(this,(int *)((long)&uStack_38 + 4));
    if (pcVar6 == (char *)0x0) {
      return (char *)0x0;
    }
    cVar7 = (char)iVar1 + '\x1e';
    if (pcVar4 != (char *)0x0) {
      regtail(pcVar4,pcVar6);
      pcVar6 = pcVar4;
    }
  }
  uVar2 = *flagp & 0xfffffffe;
  if ((uStack_38 & 0x100000000) != 0) {
    uVar2 = *flagp;
  }
  *flagp = uStack_38._4_4_ & 4 | uVar2;
  pcVar4 = this->regparse;
  if (*pcVar4 == '|') {
    do {
      this->regparse = pcVar4 + 1;
      pcVar4 = regbranch(this,(int *)((long)&uStack_38 + 4));
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      regtail(pcVar6,pcVar4);
      uVar2 = *flagp & 0xfffffffe;
      if ((uStack_38 & 0x100000000) != 0) {
        uVar2 = *flagp;
      }
      *flagp = uStack_38._4_4_ & 4 | uVar2;
      pcVar4 = this->regparse;
    } while (*pcVar4 == '|');
  }
  pcVar4 = this->regcode;
  if (pcVar4 == &regdummy) {
    this->regsize = this->regsize + 3;
  }
  else {
    *pcVar4 = cVar7;
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    this->regcode = pcVar4 + 3;
  }
  regtail(pcVar6,pcVar4);
  pcVar8 = pcVar6;
  if (pcVar6 != &regdummy) {
    do {
      if (*pcVar8 == '\x06') {
        regtail(pcVar8 + 3,pcVar4);
      }
      uVar3 = *(ushort *)(pcVar8 + 1) << 8 | *(ushort *)(pcVar8 + 1) >> 8;
      if (uVar3 == 0) break;
      uVar5 = -(ulong)uVar3;
      if (*pcVar8 != '\a') {
        uVar5 = (ulong)uVar3;
      }
      pcVar8 = pcVar8 + uVar5;
    } while (pcVar8 != &regdummy);
  }
  pcVar4 = this->regparse;
  if (paren == 0) {
    if (*pcVar4 == '\0') {
      return pcVar6;
    }
    if (*pcVar4 != ')') {
      pcVar6 = "RegularExpression::compile(): Internal error.";
      goto LAB_0010e04c;
    }
  }
  else {
    this->regparse = pcVar4 + 1;
    if (*pcVar4 == ')') {
      return pcVar6;
    }
  }
  pcVar6 = "RegularExpression::compile(): Unmatched parentheses.";
LAB_0010e04c:
  puts(pcVar6);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpressionMatch::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return KWSYS_NULLPTR;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = KWSYS_NULLPTR;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (br == KWSYS_NULLPTR)
    return (KWSYS_NULLPTR);
  if (ret != KWSYS_NULLPTR)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (br == KWSYS_NULLPTR)
      return (KWSYS_NULLPTR);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br != KWSYS_NULLPTR; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return KWSYS_NULLPTR;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return KWSYS_NULLPTR;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return KWSYS_NULLPTR;
    }
    // NOTREACHED
  }
  return (ret);
}